

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteSparse_config.c
# Opt level: O0

c_float SuiteSparse_hypot(c_float x,c_float y)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  c_float r;
  c_float s;
  undefined8 local_18;
  
  dVar1 = ABS(in_XMM0_Qa);
  dVar2 = ABS((double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  if (dVar1 < dVar2) {
    if ((dVar2 + dVar1 != dVar2) || (local_18 = dVar2, NAN(dVar2 + dVar1) || NAN(dVar2))) {
      dVar1 = sqrt((dVar1 / dVar2) * (dVar1 / dVar2) + 1.0);
      local_18 = dVar2 * dVar1;
    }
  }
  else if ((dVar1 + dVar2 != dVar1) || (local_18 = dVar1, NAN(dVar1 + dVar2) || NAN(dVar1))) {
    dVar2 = sqrt((dVar2 / dVar1) * (dVar2 / dVar1) + 1.0);
    local_18 = dVar1 * dVar2;
  }
  return local_18;
}

Assistant:

c_float SuiteSparse_hypot (c_float x, c_float y)
{
    c_float s, r ;
    x = fabs (x) ;
    y = fabs (y) ;
    if (x >= y)
    {
        if (x + y == x)
        {
            s = x ;
        }
        else
        {
            r = y / x ;
            s = x * sqrt (1.0 + r*r) ;
        }
    }
    else
    {
        if (y + x == y)
        {
            s = y ;
        }
        else
        {
            r = x / y ;
            s = y * sqrt (1.0 + r*r) ;
        }
    }
    return (s) ;
}